

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonValue.h
# Opt level: O3

Data * __thiscall Json::JsonValue::data(JsonValue *this)

{
  Data *in_RDI;
  
  (in_RDI->data1)._M_dataplus._M_p = (pointer)&(in_RDI->data1).field_2;
  (in_RDI->data1)._M_string_length = 0;
  (in_RDI->data1).field_2._M_local_buf[0] = '\0';
  return in_RDI;
}

Assistant:

virtual Data data() const { return Data(); }